

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

int Aig_XsimInv(int Value)

{
  if (Value - 1U < 3) {
    return *(int *)(&DAT_007a29f0 + (ulong)(Value - 1U) * 4);
  }
  __assert_fail("Value == AIG_XVSX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTsim.c"
                ,0x2e,"int Aig_XsimInv(int)");
}

Assistant:

static inline int  Aig_XsimInv( int Value )   
{ 
    if ( Value == AIG_XVS0 )
        return AIG_XVS1;
    if ( Value == AIG_XVS1 )
        return AIG_XVS0;
    assert( Value == AIG_XVSX );       
    return AIG_XVSX;
}